

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_frame_prep_tx(nni_ws *ws,ws_frame *frame)

{
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  uint8_t *local_58;
  size_t n;
  uint8_t *puStack_48;
  uint i;
  uint8_t *buf;
  size_t len;
  nni_iov *pnStack_30;
  uint niov;
  nni_iov *iov;
  nng_aio *aio;
  ws_frame *frame_local;
  nni_ws *ws_local;
  
  iov = (nni_iov *)frame->aio;
  frame->len = 0;
  aio = (nng_aio *)frame;
  frame_local = (ws_frame *)ws;
  nni_aio_get_iov((nni_aio *)iov,(uint *)((long)&len + 4),&stack0xffffffffffffffd0);
  for (n._4_4_ = 0; n._4_4_ < len._4_4_; n._4_4_ = n._4_4_ + 1) {
    (aio->a_task).task_cv.mtx =
         (pthread_mutex_t *)(((aio->a_task).task_cv.mtx)->__size + pnStack_30[n._4_4_].iov_len);
  }
  if ((*(pthread_mutex_t **)&frame_local[0xb].op < (aio->a_task).task_cv.mtx) &&
     (lVar1._0_4_ = frame_local[0xb].op, lVar1._4_1_ = frame_local[0xb].final,
     lVar1._5_1_ = frame_local[0xb].masked,
     lVar1._6_2_ = *(undefined2 *)&frame_local[0xb].field_0xb6, lVar1 != 0)) {
    (aio->a_task).task_cv.mtx = *(pthread_mutex_t **)&frame_local[0xb].op;
    *(bool *)((long)&aio->a_iov[0].iov_buf + 4) = (frame_local->sdata[0x33] & 1) != 0;
  }
  else {
    *(undefined1 *)((long)&aio->a_iov[0].iov_buf + 4) = 1;
  }
  if (((pthread_mutex_t *)aio->a_iov[0].iov_len < (aio->a_task).task_cv.mtx) &&
     ((aio->a_task).task_cv.mtx != (pthread_mutex_t *)0x0)) {
    nni_free(aio->a_iov[1].iov_buf,aio->a_iov[0].iov_len);
    pvVar2 = nni_alloc((size_t)(aio->a_task).task_cv.mtx);
    aio->a_iov[1].iov_buf = pvVar2;
    if (aio->a_iov[1].iov_buf == (void *)0x0) {
      aio->a_iov[0].iov_len = 0;
      return 2;
    }
    aio->a_iov[0].iov_len = (size_t)(aio->a_task).task_cv.mtx;
    aio->a_iov[1].iov_len = (size_t)aio->a_iov[1].iov_buf;
  }
  puStack_48 = (uint8_t *)aio->a_iov[1].iov_len;
  for (buf = (uint8_t *)(aio->a_task).task_cv.mtx; buf != (uint8_t *)0x0;
      buf = buf + -(long)local_58) {
    local_58 = buf;
    if ((uint8_t *)pnStack_30->iov_len < buf) {
      local_58 = (uint8_t *)pnStack_30->iov_len;
    }
    memcpy(puStack_48,pnStack_30->iov_buf,(size_t)local_58);
    pnStack_30 = pnStack_30 + 1;
    puStack_48 = local_58 + (long)puStack_48;
  }
  sVar3 = nni_aio_count((nni_aio *)iov);
  if (sVar3 == 0) {
    if ((frame_local->sdata[0x35] & 1) == 0) {
      *(undefined4 *)&aio->a_iov[0].iov_buf = 2;
    }
    else {
      *(undefined4 *)&aio->a_iov[0].iov_buf = 1;
    }
  }
  else {
    *(undefined4 *)&aio->a_iov[0].iov_buf = 0;
  }
  *(char *)&aio->a_timeout = (char)*(undefined4 *)&aio->a_iov[0].iov_buf;
  *(undefined8 *)((long)&(aio->a_task).task_cv.cv + 0x28) = 2;
  if (((ulong)aio->a_iov[0].iov_buf & 0x100000000) != 0) {
    *(byte *)&aio->a_timeout = (byte)aio->a_timeout | 0x80;
  }
  if ((aio->a_task).task_cv.mtx < (pthread_mutex_t *)0x7e) {
    *(byte *)((long)&aio->a_timeout + 1) = (byte)(aio->a_task).task_cv.mtx & 0x7f;
  }
  else if ((aio->a_task).task_cv.mtx < (pthread_mutex_t *)0x10000) {
    *(undefined1 *)((long)&aio->a_timeout + 1) = 0x7e;
    *(char *)((long)&aio->a_timeout + 2) = (char)((ulong)(aio->a_task).task_cv.mtx >> 8);
    *(char *)((long)&aio->a_timeout + 3) = (char)(aio->a_task).task_cv.mtx;
    *(long *)((long)&(aio->a_task).task_cv.cv + 0x28) =
         *(long *)((long)&(aio->a_task).task_cv.cv + 0x28) + 2;
  }
  else {
    *(undefined1 *)((long)&aio->a_timeout + 1) = 0x7f;
    *(char *)((long)&aio->a_timeout + 2) = (char)((ulong)(aio->a_task).task_cv.mtx >> 0x38);
    *(char *)((long)&aio->a_timeout + 3) = (char)((ulong)(aio->a_task).task_cv.mtx >> 0x30);
    *(char *)&aio->a_result = (char)((ulong)(aio->a_task).task_cv.mtx >> 0x28);
    *(byte *)((long)&aio->a_result + 1) = (byte)((ulong)(aio->a_task).task_cv.mtx >> 0x20);
    *(byte *)((long)&aio->a_result + 2) = (byte)((ulong)(aio->a_task).task_cv.mtx >> 0x18);
    *(byte *)((long)&aio->a_result + 3) = (byte)((ulong)(aio->a_task).task_cv.mtx >> 0x10);
    aio->a_stop = SUB81((ulong)(aio->a_task).task_cv.mtx >> 8,0);
    aio->a_sleep = SUB81((aio->a_task).task_cv.mtx,0);
    *(long *)((long)&(aio->a_task).task_cv.cv + 0x28) =
         *(long *)((long)&(aio->a_task).task_cv.cv + 0x28) + 8;
  }
  *(undefined1 *)((long)&aio->a_iov[0].iov_buf + 5) = 0;
  if ((frame_local->sdata[0x2e] & 1) == 0) {
    ws_mask_frame((ws_frame *)aio);
  }
  return 0;
}

Assistant:

static int
ws_frame_prep_tx(nni_ws *ws, ws_frame *frame)
{
	nng_aio *aio = frame->aio;
	nni_iov *iov;
	unsigned niov;
	size_t   len;
	uint8_t *buf;

	// Figure out how much we need for the entire aio.
	frame->len = 0;
	nni_aio_get_iov(aio, &niov, &iov);
	for (unsigned i = 0; i < niov; i++) {
		frame->len += iov[i].iov_len;
	}

	if ((frame->len > ws->fragsize) && (ws->fragsize > 0)) {
		// Limit it to a single frame per policy (fragsize), as needed.
		frame->len = ws->fragsize;
		// For stream mode, we constrain ourselves to one frame
		// per message. Submitter may see a partial transmit, and
		// should resubmit as needed.  For message mode, we will
		// continue to resubmit.
		frame->final = ws->isstream ? true : false;
	} else {
		// It all fits in this frame (which might not be the first),
		// so we're done.
		frame->final = true;
	}
	// Potentially allocate space for the data if we need to.
	// Note that an empty message is legal.
	if ((frame->asize < frame->len) && (frame->len > 0)) {
		nni_free(frame->adata, frame->asize);
		frame->adata = nni_alloc(frame->len);
		if (frame->adata == NULL) {
			frame->asize = 0;
			return (NNG_ENOMEM);
		}
		frame->asize = frame->len;
		frame->buf   = frame->adata;
	}
	buf = frame->buf;

	// Now copy the data into the frame.
	len = frame->len;
	while (len != 0) {
		size_t n = len;
		if (n > iov->iov_len) {
			n = iov->iov_len;
		}
		memcpy(buf, iov->iov_buf, n);
		iov++;
		len -= n;
		buf += n;
	}

	if (nni_aio_count(aio) == 0) {
		// This is the first frame.
		if (ws->send_text) {
			frame->op = WS_TEXT;
		} else {
			frame->op = WS_BINARY;
		}
	} else {
		frame->op = WS_CONT;
	}

	// Populate the frame header.
	frame->head[0] = frame->op;
	frame->hlen    = 2;
	if (frame->final) {
		frame->head[0] |= 0x80; // final frame bit
	}
	if (frame->len < 126) {
		frame->head[1] = frame->len & 0x7f;
	} else if (frame->len < 65536) {
		frame->head[1] = 126;
		NNI_PUT16(frame->head + 2, (frame->len & 0xffff));
		frame->hlen += 2;
	} else {
		frame->head[1] = 127;
		NNI_PUT64(frame->head + 2, (uint64_t) frame->len);
		frame->hlen += 8;
	}

	// If we are on the client, then we need to mask the frame.
	frame->masked = false;
	if (!ws->server) {
		ws_mask_frame(frame);
	}
	return (0);
}